

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRMatrix4 * MinVR::operator*(VRMatrix4 *m,float *s)

{
  float *pfVar1;
  float *in_RDX;
  VRMatrix4 *in_RSI;
  VRMatrix4 *in_RDI;
  float fVar2;
  int c;
  int r;
  VRMatrix4 *result;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_24;
  undefined4 local_20;
  
  VRMatrix4::VRMatrix4((VRMatrix4 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      fVar2 = VRMatrix4::operator()(in_RSI,local_20,local_24);
      fVar2 = fVar2 * *in_RDX;
      pfVar1 = VRMatrix4::operator()(in_RDI,local_20,local_24);
      *pfVar1 = fVar2;
    }
  }
  return in_RDI;
}

Assistant:

VRMatrix4 operator*(const VRMatrix4& m, const float& s) {
  VRMatrix4 result;
  for (int r = 0; r < 4; r++) {
    for (int c = 0; c < 4; c++) {
      result(r,c) = m(r,c) * s;
    }
  }
  return result;
}